

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O1

int checkBufYUV(uchar *buf,int w,int h,int subsamp,tjscalingfactor sf)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  char *__format;
  undefined8 uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  uchar *puVar26;
  uchar *local_88;
  
  iVar9 = tjMCUWidth[(uint)subsamp];
  iVar12 = iVar9 + 7;
  if (-1 < iVar9) {
    iVar12 = iVar9;
  }
  iVar12 = iVar12 >> 3;
  iVar9 = tjMCUHeight[(uint)subsamp];
  iVar17 = iVar9 + 7;
  if (-1 < iVar9) {
    iVar17 = iVar9;
  }
  iVar17 = iVar17 >> 3;
  uVar19 = -iVar12 & (w + iVar12) - 1U;
  uVar11 = -iVar17 & (h + iVar17) - 1U;
  uVar8 = (long)(int)uVar19 / (long)iVar12 & 0xffffffff;
  uVar4 = (int)uVar11 / iVar17;
  iVar6 = (int)((long)(int)uVar19 / (long)iVar12);
  uVar13 = (pad + uVar19) - 1 & -pad;
  uVar7 = (iVar6 + pad) - 1U & -pad;
  iVar9 = sf.num;
  iVar20 = sf.denom;
  iVar5 = (iVar9 * 8) / iVar20;
  if ((int)uVar11 < 1) {
    iVar21 = 1;
  }
  else {
    lVar25 = (long)((iVar9 << 4) / iVar20);
    iVar21 = 1;
    uVar10 = 0;
    puVar26 = buf;
    do {
      if (0 < (int)uVar19) {
        uVar23 = 0;
        do {
          bVar1 = puVar26[uVar23];
          if (((int)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff) /
                    (long)iVar5) +
               (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                    (long)iVar5) & 1U) == 0) {
            bVar3 = true;
            if ((long)uVar10 < lVar25) {
              if (bVar1 < 0xfe) {
                pcVar14 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00108ef8:
                printf(pcVar14,"y",uVar10 & 0xffffffff,uVar23 & 0xffffffff,(ulong)bVar1);
LAB_00108f3b:
                exitStatus = -1;
                iVar21 = 0;
                bVar3 = false;
              }
            }
            else if (1 < bVar1) {
              pcVar14 = "\nComp. %s at %d,%d should be 0, not %d\n";
              goto LAB_00108ef8;
            }
          }
          else if ((long)uVar10 < lVar25) {
            bVar3 = true;
            if ((byte)(bVar1 + 0xb2) < 0xfd) {
              uVar15 = 0x4c;
LAB_00108f34:
              printf("\nComp. %s at %d,%d should be %d, not %d\n","y",uVar10 & 0xffffffff,
                     uVar23 & 0xffffffff,uVar15);
              goto LAB_00108f3b;
            }
          }
          else {
            bVar3 = true;
            if ((byte)(bVar1 + 0x1c) < 0xfd) {
              uVar15 = 0xe2;
              goto LAB_00108f34;
            }
          }
          if (!bVar3) goto LAB_00109183;
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      uVar10 = uVar10 + 1;
      puVar26 = puVar26 + (int)uVar13;
    } while (uVar10 != uVar11);
  }
  if ((subsamp != 3) && (0 < (int)uVar4)) {
    local_88 = buf + (int)(uVar13 * uVar11);
    iVar24 = uVar13 * uVar11 + uVar7 * uVar4;
    uVar10 = 0;
    do {
      if (0 < iVar6) {
        iVar22 = 0;
        uVar23 = 0;
        do {
          bVar1 = local_88[uVar23];
          uVar16 = (ulong)bVar1;
          bVar2 = buf[(int)uVar23 + iVar24];
          uVar18 = (ulong)bVar2;
          if ((iVar22 / iVar5 + (iVar17 * (int)uVar10) / iVar5 & 1U) == 0) {
            if ((byte)(bVar1 + 0x7e) < 0xfd) {
              uVar15 = 0x80;
LAB_0010908f:
              pcVar14 = "u";
              uVar18 = uVar16;
            }
            else {
              bVar3 = true;
              if (0xfc < (byte)(bVar2 + 0x7e)) goto LAB_00109140;
              pcVar14 = "v";
              uVar15 = 0x80;
            }
LAB_0010912a:
            printf("\nComp. %s at %d,%d should be %d, not %d\n",pcVar14,uVar10 & 0xffffffff,
                   uVar23 & 0xffffffff,uVar15,uVar18);
LAB_00109131:
            exitStatus = -1;
            iVar21 = 0;
            bVar3 = false;
          }
          else if ((long)uVar10 < (long)(((int)(0x10 / (long)iVar17) * iVar9) / iVar20)) {
            if ((byte)(bVar1 + 0xa9) < 0xfd) {
              uVar15 = 0x55;
              goto LAB_0010908f;
            }
            bVar3 = true;
            if (bVar2 < 0xfe) {
              __format = "\nComp. %s at %d,%d should be 255, not %d\n";
              pcVar14 = "v";
              uVar16 = uVar18;
              goto LAB_001090fd;
            }
          }
          else {
            if (1 < bVar1) {
              __format = "\nComp. %s at %d,%d should be 0, not %d\n";
              pcVar14 = "u";
LAB_001090fd:
              printf(__format,pcVar14,uVar10 & 0xffffffff,uVar23 & 0xffffffff,uVar16);
              goto LAB_00109131;
            }
            bVar3 = true;
            if ((byte)(bVar2 + 0x69) < 0xfd) {
              pcVar14 = "v";
              uVar15 = 0x95;
              goto LAB_0010912a;
            }
          }
LAB_00109140:
          if (!bVar3) goto LAB_00109183;
          uVar23 = uVar23 + 1;
          iVar22 = iVar22 + iVar12;
        } while (uVar8 != uVar23);
      }
      uVar10 = uVar10 + 1;
      local_88 = local_88 + (int)uVar7;
      iVar24 = iVar24 + uVar7;
    } while (uVar10 != uVar4);
  }
LAB_00109183:
  if (iVar21 == 0) {
    if (0 < (int)uVar11) {
      uVar10 = 0;
      puVar26 = buf;
      do {
        if (0 < (int)uVar19) {
          uVar23 = 0;
          do {
            printf("%.3d ",(ulong)puVar26[uVar23]);
            uVar23 = uVar23 + 1;
          } while (uVar19 != uVar23);
        }
        putchar(10);
        uVar10 = uVar10 + 1;
        puVar26 = puVar26 + (int)uVar13;
      } while (uVar10 != uVar11);
    }
    putchar(10);
    if (0 < (int)uVar4) {
      iVar9 = uVar13 * uVar11;
      uVar19 = 0;
      do {
        uVar10 = uVar8;
        iVar12 = iVar9;
        if (0 < iVar6) {
          do {
            printf("%.3d ",(ulong)buf[iVar12]);
            uVar10 = uVar10 - 1;
            iVar12 = iVar12 + 1;
          } while (uVar10 != 0);
        }
        putchar(10);
        uVar19 = uVar19 + 1;
        iVar9 = iVar9 + uVar7;
      } while (uVar19 != uVar4);
    }
    putchar(10);
    if (0 < (int)uVar4) {
      iVar9 = uVar7 * uVar4 + uVar13 * uVar11;
      uVar11 = 0;
      do {
        uVar10 = uVar8;
        iVar12 = iVar9;
        if (0 < iVar6) {
          do {
            printf("%.3d ",(ulong)buf[iVar12]);
            uVar10 = uVar10 - 1;
            iVar12 = iVar12 + 1;
          } while (uVar10 != 0);
        }
        putchar(10);
        uVar11 = uVar11 + 1;
        iVar9 = iVar9 + uVar7;
      } while (uVar11 != uVar4);
    }
  }
  return iVar21;
}

Assistant:

static int checkBufYUV(unsigned char *buf, int w, int h, int subsamp,
                       tjscalingfactor sf)
{
  int row, col;
  int hsf = tjMCUWidth[subsamp] / 8, vsf = tjMCUHeight[subsamp] / 8;
  int pw = PAD(w, hsf), ph = PAD(h, vsf);
  int cw = pw / hsf, ch = ph / vsf;
  int ypitch = PAD(pw, pad), uvpitch = PAD(cw, pad);
  int retval = 1;
  int halfway = 16 * sf.num / sf.denom;
  int blocksize = 8 * sf.num / sf.denom;

  for (row = 0; row < ph; row++) {
    for (col = 0; col < pw; col++) {
      unsigned char y = buf[ypitch * row + col];

      if (((row / blocksize) + (col / blocksize)) % 2 == 0) {
        if (row < halfway) CHECKVAL255(y)
        else CHECKVAL0(y);
      } else {
        if (row < halfway) CHECKVAL(y, 76)
        else CHECKVAL(y, 226);
      }
    }
  }
  if (subsamp != TJSAMP_GRAY) {
    halfway = 16 / vsf * sf.num / sf.denom;

    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++) {
        unsigned char u = buf[ypitch * ph + (uvpitch * row + col)],
          v = buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)];

        if (((row * vsf / blocksize) + (col * hsf / blocksize)) % 2 == 0) {
          CHECKVAL(u, 128);  CHECKVAL(v, 128);
        } else {
          if (row < halfway) {
            CHECKVAL(u, 85);  CHECKVAL255(v);
          } else {
            CHECKVAL0(u);  CHECKVAL(v, 149);
          }
        }
      }
    }
  }

bailout:
  if (retval == 0) {
    for (row = 0; row < ph; row++) {
      for (col = 0; col < pw; col++)
        printf("%.3d ", buf[ypitch * row + col]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ", buf[ypitch * ph + (uvpitch * row + col)]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ",
               buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)]);
      printf("\n");
    }
  }

  return retval;
}